

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O0

void __thiscall wasm_importtype_t::wasm_importtype_t(wasm_importtype_t *this,ImportType *it)

{
  pointer pEVar1;
  size_t sVar2;
  wasm_byte_t *pwVar3;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_20;
  ImportType *local_18;
  ImportType *it_local;
  wasm_importtype_t *this_local;
  
  local_18 = it;
  it_local = &this->I;
  wabt::interp::ImportType::ImportType(&this->I,it);
  pEVar1 = std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>
           ::operator->(&it->type);
  (*pEVar1->_vptr_ExternType[2])(&local_20);
  wasm_externtype_t::New((wasm_externtype_t *)&this->extern_,&local_20);
  std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
  ~unique_ptr(&local_20);
  sVar2 = std::__cxx11::string::size();
  (this->module).size = sVar2;
  pwVar3 = (wasm_byte_t *)std::__cxx11::string::data();
  (this->module).data = pwVar3;
  sVar2 = std::__cxx11::string::size();
  (this->name).size = sVar2;
  pwVar3 = (wasm_byte_t *)std::__cxx11::string::data();
  (this->name).data = pwVar3;
  return;
}

Assistant:

wasm_importtype_t(ImportType it)
      : I(it),
        extern_{wasm_externtype_t::New(it.type->Clone())},
        module{I.module.size(), const_cast<wasm_byte_t*>(I.module.data())},
        name{I.name.size(), const_cast<wasm_byte_t*>(I.name.data())} {}